

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

BDD sylvan_sat_single(BDD bdd,BDDSET vars)

{
  int iVar1;
  uint32_t var_00;
  uint32_t uVar2;
  mtbddnode_t pmVar3;
  MTBDD vars_00;
  BDD BVar4;
  MTBDD MVar5;
  BDD res;
  BDD res_3;
  BDD res_2;
  mtbddnode_t n_bdd;
  BDD res_1;
  BDD next_vars;
  uint32_t var;
  mtbddnode_t n_vars;
  BDDSET vars_local;
  BDD bdd_local;
  
  if (bdd == 0) {
    bdd_local = 0;
  }
  else {
    iVar1 = mtbdd_set_isempty(vars);
    if (iVar1 == 0) {
      pmVar3 = MTBDD_GETNODE(vars);
      var_00 = mtbddnode_getvariable(pmVar3);
      vars_00 = mtbddnode_followhigh(vars,pmVar3);
      if (bdd == 0x8000000000000000) {
        BVar4 = sylvan_sat_single(0x8000000000000000,vars_00);
        bdd_local = mtbdd_makenode(var_00,BVar4,0);
      }
      else {
        pmVar3 = MTBDD_GETNODE(bdd);
        uVar2 = mtbddnode_getvariable(pmVar3);
        if (uVar2 == var_00) {
          MVar5 = mtbddnode_followhigh(bdd,pmVar3);
          if (MVar5 == 0) {
            MVar5 = mtbddnode_followlow(bdd,pmVar3);
            BVar4 = sylvan_sat_single(MVar5,vars_00);
            bdd_local = mtbdd_makenode(var_00,BVar4,0);
          }
          else {
            MVar5 = mtbddnode_followhigh(bdd,pmVar3);
            BVar4 = sylvan_sat_single(MVar5,vars_00);
            bdd_local = mtbdd_makenode(var_00,0,BVar4);
          }
        }
        else {
          uVar2 = mtbddnode_getvariable(pmVar3);
          if (uVar2 <= var_00) {
            __assert_fail("bddnode_getvariable(n_bdd)>var",
                          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                          ,0x71a,"BDD sylvan_sat_single(BDD, BDDSET)");
          }
          BVar4 = sylvan_sat_single(bdd,vars_00);
          bdd_local = mtbdd_makenode(var_00,BVar4,0);
        }
      }
    }
    else {
      if (bdd != 0x8000000000000000) {
        __assert_fail("bdd == sylvan_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                      ,0x70c,"BDD sylvan_sat_single(BDD, BDDSET)");
      }
      bdd_local = 0x8000000000000000;
    }
  }
  return bdd_local;
}

Assistant:

BDD
sylvan_sat_single(BDD bdd, BDDSET vars)
{
    if (bdd == sylvan_false) return sylvan_false;
    if (sylvan_set_isempty(vars)) {
        assert(bdd == sylvan_true);
        return sylvan_true;
    }

    bddnode_t n_vars = MTBDD_GETNODE(vars);
    uint32_t var = bddnode_getvariable(n_vars);
    BDD next_vars = node_high(vars, n_vars);
    if (bdd == sylvan_true) {
        // take false
        BDD res = sylvan_sat_single(bdd, next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    bddnode_t n_bdd = MTBDD_GETNODE(bdd);
    if (bddnode_getvariable(n_bdd) != var) {
        assert(bddnode_getvariable(n_bdd)>var);
        // take false
        BDD res = sylvan_sat_single(bdd, next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    if (node_high(bdd, n_bdd) == sylvan_false) {
        // take false
        BDD res = sylvan_sat_single(node_low(bdd, n_bdd), next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    // take true
    BDD res = sylvan_sat_single(node_high(bdd, n_bdd), next_vars);
    return sylvan_makenode(var, sylvan_false, res);
}